

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::ShoutyToPascalCase_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,string_view input)

{
  csharp *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (csharp *)0x0) {
    pcVar1 = (csharp *)0x0;
    do {
      if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar1[input._M_len]] & 4) !=
          0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pcVar1 = pcVar1 + 1;
    } while (this != pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ShoutyToPascalCase(absl::string_view input) {
  std::string result;
  // Simple way of implementing "always start with upper"
  char previous = '_';
  for (int i = 0; i < input.size(); i++) {
    char current = input[i];
    if (!absl::ascii_isalnum(current)) {
      previous = current;
      continue;
    }
    if (!absl::ascii_isalnum(previous)) {
      result += absl::ascii_toupper(current);
    } else if (absl::ascii_isdigit(previous)) {
      result += absl::ascii_toupper(current);
    } else if (absl::ascii_islower(previous)) {
      result += current;
    } else {
      result += absl::ascii_tolower(current);
    }
    previous = current;
  }
  return result;
}